

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_device_read__null
                    (ma_device *pDevice,void *pPCMFrames,ma_uint32 frameCount,ma_uint32 *pFramesRead
                    )

{
  ma_uint32 mVar1;
  ma_uint32 mVar2;
  int iVar3;
  ma_uint64 mVar4;
  ma_uint64 currentFrame;
  ma_uint32 framesToProcess;
  ma_uint32 framesRemaining;
  ma_uint32 bpf;
  ma_uint64 targetFrame;
  ma_uint32 totalPCMFramesProcessed;
  ma_result result;
  ma_uint32 *pFramesRead_local;
  ma_uint32 frameCount_local;
  void *pPCMFrames_local;
  ma_device *pDevice_local;
  
  if (pFramesRead != (ma_uint32 *)0x0) {
    *pFramesRead = 0;
  }
  targetFrame._0_4_ = 0;
  while ((uint)targetFrame < frameCount) {
    if ((pDevice->field_23).null_device.currentPeriodFramesRemainingCapture != 0) {
      mVar1 = (pDevice->capture).internalChannels;
      mVar2 = ma_get_bytes_per_sample((pDevice->capture).internalFormat);
      iVar3 = mVar2 * mVar1;
      currentFrame._4_4_ = (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture;
      if (frameCount - (uint)targetFrame < currentFrame._4_4_) {
        currentFrame._4_4_ = frameCount - (uint)targetFrame;
      }
      memset((void *)((long)pPCMFrames + (ulong)((uint)targetFrame * iVar3)),0,
             (ulong)(currentFrame._4_4_ * iVar3));
      (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture =
           (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture - currentFrame._4_4_;
      targetFrame._0_4_ = currentFrame._4_4_ + (uint)targetFrame;
    }
    if ((pDevice->field_23).null_device.currentPeriodFramesRemainingCapture == 0) {
      (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture = 0;
    }
    if (frameCount < (uint)targetFrame) {
      __assert_fail("totalPCMFramesProcessed <= frameCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x25c1,
                    "ma_result ma_device_read__null(ma_device *, void *, ma_uint32, ma_uint32 *)");
    }
    if ((uint)targetFrame == frameCount) break;
    mVar1 = (pDevice->field_23).null_device.lastProcessedFrameCapture;
    mVar2 = (pDevice->capture).internalPeriodSizeInFrames;
    while (((pDevice->field_23).null_device.isStarted != 0 &&
           (mVar4 = ma_device_get_total_run_time_in_frames__null(pDevice), mVar4 < mVar1 + mVar2)))
    {
      ma_sleep(10);
    }
    (pDevice->field_23).null_device.lastProcessedFrameCapture =
         (pDevice->capture).internalPeriodSizeInFrames +
         (pDevice->field_23).null_device.lastProcessedFrameCapture;
    (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture =
         (pDevice->capture).internalPeriodSizeInFrames;
  }
  if (pFramesRead != (ma_uint32 *)0x0) {
    *pFramesRead = (uint)targetFrame;
  }
  return 0;
}

Assistant:

static ma_result ma_device_read__null(ma_device* pDevice, void* pPCMFrames, ma_uint32 frameCount, ma_uint32* pFramesRead)
{
    ma_result result = MA_SUCCESS;
    ma_uint32 totalPCMFramesProcessed;

    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    /* Keep going until everything has been read. */
    totalPCMFramesProcessed = 0;
    while (totalPCMFramesProcessed < frameCount) {
        ma_uint64 targetFrame;

        /* If there are any frames remaining in the current period, consume those first. */
        if (pDevice->null_device.currentPeriodFramesRemainingCapture > 0) {
            ma_uint32 bpf = ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels);
            ma_uint32 framesRemaining = (frameCount - totalPCMFramesProcessed);
            ma_uint32 framesToProcess = pDevice->null_device.currentPeriodFramesRemainingCapture;
            if (framesToProcess > framesRemaining) {
                framesToProcess = framesRemaining;
            }

            /* We need to ensured the output buffer is zeroed. */
            MA_ZERO_MEMORY(ma_offset_ptr(pPCMFrames, totalPCMFramesProcessed*bpf), framesToProcess*bpf);

            pDevice->null_device.currentPeriodFramesRemainingCapture -= framesToProcess;
            totalPCMFramesProcessed += framesToProcess;
        }

        /* If we've consumed the current period we'll need to mark it as such an ensure the device is started if it's not already. */
        if (pDevice->null_device.currentPeriodFramesRemainingCapture == 0) {
            pDevice->null_device.currentPeriodFramesRemainingCapture = 0;
        }

        /* If we've consumed the whole buffer we can return now. */
        MA_ASSERT(totalPCMFramesProcessed <= frameCount);
        if (totalPCMFramesProcessed == frameCount) {
            break;
        }

        /* Getting here means we've still got more frames to consume, we but need to wait for it to become available. */
        targetFrame = pDevice->null_device.lastProcessedFrameCapture + pDevice->capture.internalPeriodSizeInFrames;
        for (;;) {
            ma_uint64 currentFrame;

            /* Stop waiting if the device has been stopped. */
            if (!pDevice->null_device.isStarted) {
                break;
            }

            currentFrame = ma_device_get_total_run_time_in_frames__null(pDevice);
            if (currentFrame >= targetFrame) {
                break;
            }

            /* Getting here means we haven't yet reached the target sample, so continue waiting. */
            ma_sleep(10);
        }

        pDevice->null_device.lastProcessedFrameCapture          += pDevice->capture.internalPeriodSizeInFrames;
        pDevice->null_device.currentPeriodFramesRemainingCapture = pDevice->capture.internalPeriodSizeInFrames;
    }

    if (pFramesRead != NULL) {
        *pFramesRead = totalPCMFramesProcessed;
    }

    return result;
}